

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_request.hpp
# Opt level: O0

string_view __thiscall cinatra::coro_http_request::get_boundary(coro_http_request *this)

{
  bool bVar1;
  size_type sVar2;
  string_view sVar3;
  coro_http_request *unaff_retaddr;
  size_type pos;
  string_view content_type;
  char *in_stack_ffffffffffffffc8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd0;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  sVar3 = get_header_value(unaff_retaddr,_pos);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd8);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_10);
  }
  else {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                      ((basic_string_view<char,_std::char_traits<char>_> *)sVar3._M_str,
                       (char *)sVar3._M_len,(size_type)in_stack_ffffffffffffffd0);
    if (sVar2 == 0xffffffffffffffff) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
    else {
      local_10 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)sVar3._M_str,
                            sVar3._M_len,(size_type)in_stack_ffffffffffffffd0);
    }
  }
  sVar3._M_len = local_10._M_len;
  sVar3._M_str = local_10._M_str;
  return sVar3;
}

Assistant:

std::string_view get_boundary() {
    auto content_type = get_header_value("content-type");
    if (content_type.empty()) {
      return {};
    }

    auto pos = content_type.rfind("=");
    if (pos == std::string_view::npos) {
      return "";
    }

    return content_type.substr(pos + 1);
  }